

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

nodedata ** Node_GetDataStart(node *Node,dataid Id,datatype Type)

{
  nodedata *pnVar1;
  nodedata *pnVar2;
  
  pnVar2 = (nodedata *)&Node->Data;
  do {
    pnVar1 = pnVar2;
    pnVar2 = pnVar2->Next;
    if (pnVar2 == (nodedata *)0x0) {
      return (nodedata **)0x0;
    }
  } while (pnVar2->Code != (Id << 8 | Type));
  return &pnVar1->Next;
}

Assistant:

NOINLINE nodedata** Node_GetDataStart(node* Node, dataid Id, datatype Type)
{
    uint_fast32_t Code = (Id<<DYNDATA_SHIFT)|Type;
    nodedata** i;

    for (i=&Node->Data;*i;i=&(*i)->Next)
        if ((*i)->Code == Code)
        {
            return i;
        }

    return NULL;
}